

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

void Vga_ManAddClausesOne(Vta_Man_t *p,int iObj,int iFrame)

{
  sat_solver2 *psVar1;
  int Entry;
  int iVar2;
  int iVar3;
  int fCompl0;
  int fCompl1;
  Gia_Obj_t *pGVar4;
  Vta_Obj_t *pVVar5;
  int iMainVar;
  int iThis0;
  Vta_Obj_t *pThis;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *pThis0;
  int iFrame_local;
  int iObj_local;
  Vta_Man_t *p_local;
  
  pGVar4 = Gia_ManObj(p->pGia,iObj);
  pVVar5 = Vga_ManFindOrAdd(p,iObj,iFrame);
  Entry = Vta_ObjId(p,pVVar5);
  if ((pVVar5->iObj == iObj) && (pVVar5->iFrame == iFrame)) {
    if ((*(uint *)&pVVar5->field_0xc >> 0x1e & 1) == 0) {
      *(uint *)&pVVar5->field_0xc = *(uint *)&pVVar5->field_0xc & 0xbfffffff | 0x40000000;
      Vec_IntPush(p->vAddedNew,Entry);
      iVar2 = Gia_ObjIsAnd(pGVar4);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsRo(p->pGia,pGVar4);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsConst0(pGVar4);
          if (iVar2 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                          ,0x513,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
          }
          sat_solver2_add_const(p->pSat,Entry,1,0,Entry);
        }
        else if (iFrame == 0) {
          if (p->pPars->fUseTermVars == 0) {
            sat_solver2_add_const(p->pSat,Entry,1,0,Entry);
          }
          else {
            pVVar5 = Vga_ManFindOrAdd(p,iObj,-1);
            psVar1 = p->pSat;
            iVar2 = Vta_ObjId(p,pVVar5);
            sat_solver2_add_constraint(psVar1,Entry,iVar2,1,0,Entry);
          }
        }
        else {
          pGVar4 = Gia_ObjRoToRi(p->pGia,pGVar4);
          iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar4);
          pVVar5 = Vga_ManFindOrAdd(p,iVar2,iFrame + -1);
          psVar1 = p->pSat;
          iVar2 = Vta_ObjId(p,pVVar5);
          iVar3 = Gia_ObjFaninC0(pGVar4);
          sat_solver2_add_buffer(psVar1,Entry,iVar2,iVar3,0,Entry);
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar4);
        pVVar5 = Vga_ManFindOrAdd(p,iVar2,iFrame);
        iVar2 = Vta_ObjId(p,pVVar5);
        iVar3 = Gia_ObjFaninId1p(p->pGia,pGVar4);
        pVVar5 = Vga_ManFindOrAdd(p,iVar3,iFrame);
        psVar1 = p->pSat;
        iVar3 = Vta_ObjId(p,pVVar5);
        fCompl0 = Gia_ObjFaninC0(pGVar4);
        fCompl1 = Gia_ObjFaninC1(pGVar4);
        sat_solver2_add_and(psVar1,Entry,iVar2,iVar3,fCompl0,fCompl1,0,Entry);
      }
    }
    return;
  }
  __assert_fail("pThis->iObj == iObj && pThis->iFrame == iFrame",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                ,0x4ec,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
}

Assistant:

void Vga_ManAddClausesOne( Vta_Man_t * p, int iObj, int iFrame )
{ 
    Vta_Obj_t * pThis0, * pThis1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
    Vta_Obj_t * pThis = Vga_ManFindOrAdd( p, iObj, iFrame );
    int iThis0, iMainVar = Vta_ObjId(p, pThis);
    assert( pThis->iObj == iObj && pThis->iFrame == iFrame );
    if ( pThis->fAdded )
        return;
    pThis->fAdded = 1;
    Vec_IntPush( p->vAddedNew, iMainVar );
    if ( Gia_ObjIsAnd(pObj) )
    {
        pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame );
        iThis0 = Vta_ObjId(p, pThis0);
        pThis1 = Vga_ManFindOrAdd( p, Gia_ObjFaninId1p(p->pGia, pObj), iFrame );
        sat_solver2_add_and( p->pSat, iMainVar, iThis0, Vta_ObjId(p, pThis1), 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0, iMainVar );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( iFrame == 0 )
        {
            if ( p->pPars->fUseTermVars )
            {
                pThis0 = Vga_ManFindOrAdd( p, iObj, -1 );
                sat_solver2_add_constraint( p->pSat, iMainVar, Vta_ObjId(p, pThis0), 1, 0, iMainVar );
            }
            else
            {
                sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
            }
        }
        else
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iMainVar, Vta_ObjId(p, pThis0), Gia_ObjFaninC0(pObj), 0, iMainVar );  
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
    }
    else //if ( !Gia_ObjIsPi(p->pGia, pObj) )
        assert( 0 );
}